

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

VRMatrix4 * __thiscall MinVR::VRMatrix4::cofactor(VRMatrix4 *__return_storage_ptr__,VRMatrix4 *this)

{
  float *pfVar1;
  int iVar2;
  int c;
  long lVar3;
  float *pfVar4;
  int r;
  long lVar5;
  float fVar6;
  
  VRMatrix4(__return_storage_ptr__);
  pfVar1 = __return_storage_ptr__->m;
  iVar2 = 1;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    pfVar4 = pfVar1;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar6 = subDeterminant(this,(int)lVar5,(int)lVar3);
      *pfVar4 = (float)iVar2 * fVar6;
      iVar2 = -iVar2;
      pfVar4 = pfVar4 + 4;
    }
    iVar2 = -iVar2;
    pfVar1 = pfVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::cofactor() const {
  VRMatrix4 out;
  // We'll use i to incrementally compute -1^(r+c)
  int i = 1;
  for (int r = 0; r < 4; ++r) {
    for (int c = 0; c < 4; ++c) {
      // Compute the determinant of the 3x3 submatrix
      float det = subDeterminant(r, c);
      out(r,c) = i * det;
      i = -i;
    }
    i = -i;
  }
  return out;
}